

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalNinjaGenerator::WriteNinjaFilesInclusion(cmLocalNinjaGenerator *this,ostream *os)

{
  ostream *poVar1;
  allocator local_4a;
  allocator local_49;
  string local_48;
  string local_28;
  
  cmGlobalNinjaGenerator::WriteDivider(os);
  poVar1 = std::operator<<(os,"# Include auxiliary files.\n");
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::string
            ((string *)&local_28,cmGlobalNinjaGenerator::NINJA_RULES_FILE,&local_49);
  std::__cxx11::string::string((string *)&local_48,"Include rules file.",&local_4a);
  cmGlobalNinjaGenerator::WriteInclude(os,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::operator<<(os,"\n");
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteNinjaFilesInclusion(std::ostream& os)
{
  cmGlobalNinjaGenerator::WriteDivider(os);
  os
    << "# Include auxiliary files.\n"
    << "\n"
    ;
  cmGlobalNinjaGenerator::WriteInclude(os,
                                      cmGlobalNinjaGenerator::NINJA_RULES_FILE,
                                       "Include rules file.");
  os << "\n";
}